

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void prepvarinfo(rnndb *db,char *what,rnnvarinfo *vi,rnnvarinfo *parent)

{
  int iVar1;
  int iVar2;
  rnnenum *prVar3;
  rnnvarset **pprVar4;
  rnnvarset *prVar5;
  int *piVar6;
  char *pcVar7;
  bool bVar8;
  char *local_90;
  rnnvarset *local_88;
  rnnvarset *vs_1;
  int idx2;
  int idx1;
  char *second;
  char *end;
  char *pcStack_60;
  int idx;
  char *first;
  char *split;
  rnnvarset *prStack_48;
  int nvars;
  rnnvarset *vs;
  char *vars;
  rnnenum *varset;
  int i;
  rnnvarinfo *parent_local;
  rnnvarinfo *vi_local;
  char *what_local;
  rnndb *db_local;
  
  if (parent != (rnnvarinfo *)0x0) {
    vi->prefenum = parent->prefenum;
  }
  if (vi->prefixstr != (char *)0x0) {
    iVar1 = strcmp(vi->prefixstr,"none");
    if (iVar1 == 0) {
      vi->prefenum = (rnnenum *)0x0;
    }
    else {
      prVar3 = rnn_findenum(db,vi->prefixstr);
      vi->prefenum = prVar3;
    }
  }
  if (parent != (rnnvarinfo *)0x0) {
    for (varset._4_4_ = 0; varset._4_4_ < parent->varsetsnum; varset._4_4_ = varset._4_4_ + 1) {
      if (vi->varsetsmax <= vi->varsetsnum) {
        if (vi->varsetsmax == 0) {
          vi->varsetsmax = 0x10;
        }
        else {
          vi->varsetsmax = vi->varsetsmax << 1;
        }
        pprVar4 = (rnnvarset **)realloc(vi->varsets,(long)vi->varsetsmax << 3);
        vi->varsets = pprVar4;
      }
      prVar5 = copyvarset(parent->varsets[varset._4_4_]);
      iVar1 = vi->varsetsnum;
      vi->varsetsnum = iVar1 + 1;
      vi->varsets[iVar1] = prVar5;
    }
  }
  vars = (char *)vi->prefenum;
  if ((((rnnenum *)vars == (rnnenum *)0x0) && (vi->varsetstr == (char *)0x0)) &&
     (parent != (rnnvarinfo *)0x0)) {
    if (parent->varsetstr == (char *)0x0) {
      local_90 = (char *)0x0;
    }
    else {
      local_90 = strdup(parent->varsetstr);
    }
    vi->varsetstr = local_90;
  }
  if (vi->varsetstr != (char *)0x0) {
    vars = (char *)rnn_findenum(db,vi->varsetstr);
  }
  if (vi->variantsstr != (char *)0x0) {
    vs = (rnnvarset *)vi->variantsstr;
    if (vars == (char *)0x0) {
      fprintf(_stderr,"%s: tried to use variants without active varset!\n",what);
      db->estatus = 1;
      return;
    }
    prStack_48 = (rnnvarset *)0x0;
    iVar1 = *(int *)(vars + 0x58);
    for (varset._4_4_ = 0; varset._4_4_ < vi->varsetsnum; varset._4_4_ = varset._4_4_ + 1) {
      if (vi->varsets[varset._4_4_]->venum == (rnnenum *)vars) {
        prStack_48 = vi->varsets[varset._4_4_];
        break;
      }
    }
    if (prStack_48 == (rnnvarset *)0x0) {
      prStack_48 = (rnnvarset *)calloc(0x10,1);
      prStack_48->venum = (rnnenum *)vars;
      piVar6 = (int *)calloc(4,(long)iVar1);
      prStack_48->variants = piVar6;
      for (varset._4_4_ = 0; varset._4_4_ < iVar1; varset._4_4_ = varset._4_4_ + 1) {
        prStack_48->variants[varset._4_4_] = 1;
      }
      if (vi->varsetsmax <= vi->varsetsnum) {
        if (vi->varsetsmax == 0) {
          vi->varsetsmax = 0x10;
        }
        else {
          vi->varsetsmax = vi->varsetsmax << 1;
        }
        pprVar4 = (rnnvarset **)realloc(vi->varsets,(long)vi->varsetsmax << 3);
        vi->varsets = pprVar4;
      }
      iVar2 = vi->varsetsnum;
      vi->varsetsnum = iVar2 + 1;
      vi->varsets[iVar2] = prStack_48;
    }
    while( true ) {
      for (; *(char *)&vs->venum == ' '; vs = (rnnvarset *)((long)&vs->venum + 1)) {
      }
      if (*(char *)&vs->venum == '\0') break;
      first = (char *)vs;
      while( true ) {
        bVar8 = false;
        if (((*first != ':') && (bVar8 = false, *first != '-')) && (bVar8 = false, *first != ' ')) {
          bVar8 = *first != '\0';
        }
        if (!bVar8) break;
        first = first + 1;
      }
      pcStack_60 = (char *)0x0;
      if ((rnnvarset *)first != vs) {
        pcStack_60 = strndup((char *)vs,(long)first - (long)vs);
      }
      if ((*first == ' ') || (second = first, *first == '\0')) {
        iVar2 = findvidx(db,(rnnenum *)vars,pcStack_60);
        if (iVar2 != -1) {
          prStack_48->variants[iVar2] = prStack_48->variants[iVar2] | 2;
        }
        vs = (rnnvarset *)first;
      }
      else {
        do {
          second = second + 1;
          bVar8 = false;
          if (*second != ' ') {
            bVar8 = *second != '\0';
          }
        } while (bVar8);
        _idx2 = (char *)0x0;
        if (second != first + 1) {
          _idx2 = strndup(first + 1,(size_t)(second + (-1 - (long)first)));
        }
        vs_1._4_4_ = 0;
        if (pcStack_60 != (char *)0x0) {
          vs_1._4_4_ = findvidx(db,(rnnenum *)vars,pcStack_60);
        }
        vs_1._0_4_ = iVar1;
        if ((_idx2 != (char *)0x0) &&
           (vs_1._0_4_ = findvidx(db,(rnnenum *)vars,_idx2), *first == '-')) {
          vs_1._0_4_ = (int)vs_1 + 1;
        }
        if ((vs_1._4_4_ != -1) && ((int)vs_1 != -1)) {
          for (varset._4_4_ = vs_1._4_4_; varset._4_4_ < (int)vs_1; varset._4_4_ = varset._4_4_ + 1)
          {
            prStack_48->variants[varset._4_4_] = prStack_48->variants[varset._4_4_] | 2;
          }
        }
        vs = (rnnvarset *)second;
        free(_idx2);
      }
      free(pcStack_60);
    }
    vi->dead = 1;
    for (varset._4_4_ = 0; varset._4_4_ < iVar1; varset._4_4_ = varset._4_4_ + 1) {
      prStack_48->variants[varset._4_4_] = (uint)(prStack_48->variants[varset._4_4_] == 3);
      if (prStack_48->variants[varset._4_4_] != 0) {
        vi->dead = 0;
      }
    }
  }
  if ((vi->dead == 0) && (vi->prefenum != (rnnenum *)0x0)) {
    local_88 = (rnnvarset *)0x0;
    for (varset._4_4_ = 0; varset._4_4_ < vi->varsetsnum; varset._4_4_ = varset._4_4_ + 1) {
      if (vi->varsets[varset._4_4_]->venum == vi->prefenum) {
        local_88 = vi->varsets[varset._4_4_];
        break;
      }
    }
    if (local_88 == (rnnvarset *)0x0) {
      pcVar7 = strdup((*vi->prefenum->vals)->name);
      vi->prefix = pcVar7;
    }
    else {
      for (varset._4_4_ = 0; varset._4_4_ < vi->prefenum->valsnum; varset._4_4_ = varset._4_4_ + 1)
      {
        if (local_88->variants[varset._4_4_] != 0) {
          pcVar7 = strdup(vi->prefenum->vals[varset._4_4_]->name);
          vi->prefix = pcVar7;
          return;
        }
      }
    }
  }
  return;
}

Assistant:

static void prepvarinfo (struct rnndb *db, char *what, struct rnnvarinfo *vi, struct rnnvarinfo *parent) {
	if (parent)
		vi->prefenum = parent->prefenum;
	if (vi->prefixstr) {
		if (!strcmp(vi->prefixstr, "none"))
			vi->prefenum = 0;
		else
			vi->prefenum = rnn_findenum(db, vi->prefixstr); // XXX
	}
	int i;
	if (parent)
		for (i = 0; i < parent->varsetsnum; i++)
			ADDARRAY(vi->varsets, copyvarset(parent->varsets[i]));
	struct rnnenum *varset = vi->prefenum;
	if (!varset && !vi->varsetstr && parent)
		vi->varsetstr = parent->varsetstr ? strdup(parent->varsetstr) : NULL;
	if (vi->varsetstr)
		varset = rnn_findenum(db, vi->varsetstr);
	if (vi->variantsstr) {
		char *vars = vi->variantsstr;
		if (!varset) {
			fprintf (stderr, "%s: tried to use variants without active varset!\n", what);
			db->estatus = 1;
			return;
		}
		struct rnnvarset *vs = 0;
		int nvars = varset->valsnum;
		for (i = 0; i < vi->varsetsnum; i++)
			if (vi->varsets[i]->venum == varset) {
				vs = vi->varsets[i];
				break;
			}
		if (!vs) {
			vs = calloc (sizeof *vs, 1);
			vs->venum = varset;
			vs->variants = calloc(sizeof *vs->variants, nvars);
			for (i = 0; i < nvars; i++)
				vs->variants[i] = 1;
			ADDARRAY(vi->varsets, vs);
		}
		while (1) {
			while (*vars == ' ') vars++;
			if (*vars == 0)
				break;
			char *split = vars;
			while (*split != ':' && *split != '-' && *split != ' '  && *split != 0)
				split++;
			char *first = 0;
			if (split != vars)
				first = strndup(vars, split-vars);
			if (*split == ' ' || *split == 0) {
				int idx = findvidx(db, varset, first);
				if (idx != -1)
					vs->variants[idx] |= 2;
				vars = split;
			} else {
				char *end = split+1;
				while (*end != ' '  && *end != 0)
					end++;
				char *second = 0;
				if (end != split+1)
					second = strndup(split+1, end-split-1);
				int idx1 = 0;
				if (first)
					idx1 = findvidx(db, varset, first);
				int idx2 = nvars;
				if (second) {
					idx2 = findvidx(db, varset, second);
					if (*split == '-')
						idx2++;
				}
				if (idx1 != -1 && idx2 != -1)
					for (i = idx1; i < idx2; i++)
						vs->variants[i] |= 2;
				vars = end;
				free(second);
			}
			free(first);
		}
		vi->dead = 1;
		for (i = 0; i < nvars; i++) {
			vs->variants[i] = (vs->variants[i] == 3);
			if (vs->variants[i])
				vi->dead = 0;
		}
	}
	if (vi->dead)
		return;
	if (vi->prefenum) {
		struct rnnvarset *vs = 0;
		for (i = 0; i < vi->varsetsnum; i++)
			if (vi->varsets[i]->venum == vi->prefenum) {
				vs = vi->varsets[i];
				break;
			}
		if (vs) {
			for (i = 0; i < vi->prefenum->valsnum; i++)
				if (vs->variants[i]) {
					vi->prefix = strdup(vi->prefenum->vals[i]->name);
					return;
				}
		} else {
			vi->prefix = strdup(vi->prefenum->vals[0]->name);
		}
	}
}